

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslconfiguration.cpp
# Opt level: O0

QMap<QByteArray,_QVariant> __thiscall
QSslConfiguration::backendConfiguration(QSslConfiguration *this)

{
  QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_>
  in_RDI;
  QMap<QByteArray,_QVariant> *in_stack_ffffffffffffffd8;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_>
  this_00;
  
  this_00.d.ptr = in_RDI.d.ptr;
  QSharedDataPointer<QSslConfigurationPrivate>::operator->
            ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38e579);
  QMap<QByteArray,_QVariant>::QMap
            ((QMap<QByteArray,_QVariant> *)this_00.d.ptr,in_stack_ffffffffffffffd8);
  return (QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_>
          )(QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_>
            )in_RDI.d.ptr;
}

Assistant:

QMap<QByteArray, QVariant> QSslConfiguration::backendConfiguration() const
{
    return d->backendConfig;
}